

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue js_string_repeat(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  ulong uVar1;
  int iVar2;
  JSValueUnion p;
  uint uVar3;
  JSValue JVar4;
  int64_t val;
  StringBuffer b_s;
  
  JVar4 = JS_ToStringCheckObject(ctx,this_val);
  p = JVar4.u;
  if (((int)JVar4.tag != 6) && (iVar2 = JS_ToInt64Sat(ctx,&val,*argv), iVar2 == 0)) {
    if ((val & 0xffffffff80000000U) == 0) {
      if (val == 1) {
        return JVar4;
      }
      uVar1 = *(ulong *)((long)p.ptr + 4);
      uVar3 = (uint)uVar1 & 0x7fffffff;
      if ((uVar1 & 0x7fffffff) == 0) {
        return JVar4;
      }
      if ((ulong)((uint)uVar1 & 0x7fffffff) * val < 0x40000000) {
        iVar2 = string_buffer_init2(ctx,&b_s,uVar3 * (int)val,(uint)(uVar1 >> 0x1f) & 1);
        if (iVar2 == 0) {
          if (uVar3 == 1) {
            if ((*(byte *)((long)p.ptr + 7) & 0x80) == 0) {
              uVar3 = (uint)(byte)(((JSString *)((long)p.ptr + 0x10))->header).ref_count;
            }
            else {
              uVar3 = (uint)(ushort)(((JSString *)((long)p.ptr + 0x10))->header).ref_count;
            }
            string_buffer_fill(&b_s,uVar3,(int)val);
          }
          else {
            for (; 0 < (int)val; val = (int64_t)((int)val - 1)) {
              string_buffer_concat(&b_s,(JSString *)p.ptr,0,uVar3);
            }
          }
          JS_FreeValue(ctx,JVar4);
          JVar4 = string_buffer_end(&b_s);
          return JVar4;
        }
      }
      else {
        JS_ThrowInternalError(ctx,"string too long");
      }
    }
    else {
      JS_ThrowRangeError(ctx,"invalid repeat count");
    }
  }
  JS_FreeValue(ctx,JVar4);
  return (JSValue)(ZEXT816(6) << 0x40);
}

Assistant:

static JSValue js_string_repeat(JSContext *ctx, JSValueConst this_val,
                                int argc, JSValueConst *argv)
{
    JSValue str;
    StringBuffer b_s, *b = &b_s;
    JSString *p;
    int64_t val;
    int n, len;

    str = JS_ToStringCheckObject(ctx, this_val);
    if (JS_IsException(str))
        goto fail;
    if (JS_ToInt64Sat(ctx, &val, argv[0]))
        goto fail;
    if (val < 0 || val > 2147483647) {
        JS_ThrowRangeError(ctx, "invalid repeat count");
        goto fail;
    }
    n = val;
    p = JS_VALUE_GET_STRING(str);
    len = p->len;
    if (len == 0 || n == 1)
        return str;
    if (val * len > JS_STRING_LEN_MAX) {
        JS_ThrowInternalError(ctx, "string too long");
        goto fail;
    }
    if (string_buffer_init2(ctx, b, n * len, p->is_wide_char))
        goto fail;
    if (len == 1) {
        string_buffer_fill(b, string_get(p, 0), n);
    } else {
        while (n-- > 0) {
            string_buffer_concat(b, p, 0, len);
        }
    }
    JS_FreeValue(ctx, str);
    return string_buffer_end(b);

fail:
    JS_FreeValue(ctx, str);
    return JS_EXCEPTION;
}